

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void del_tokens(VARR_token_t *tokens,int from,int len)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if (tokens != (VARR_token_t *)0x0) {
    iVar1 = (int)tokens->els_num;
    iVar3 = iVar1 - from;
    if (-1 < len) {
      iVar3 = len;
    }
    uVar2 = iVar1 - (iVar3 + from);
    if (iVar1 < iVar3 + from) goto LAB_001959e9;
    if (0 < (int)uVar2) {
      memmove(tokens->varr + from,tokens->varr + from + iVar3,(ulong)uVar2 << 3);
    }
    if ((tokens->varr != (token_t *)0x0) && ((ulong)(long)(iVar1 - iVar3) <= tokens->els_num)) {
      tokens->els_num = (long)(iVar1 - iVar3);
      return;
    }
    del_tokens_cold_1();
  }
  del_tokens_cold_2();
LAB_001959e9:
  __assert_fail("from + len <= tokens_len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xa9b,"void del_tokens(VARR_token_t *, int, int)");
}

Assistant:

static void del_tokens (VARR (token_t) * tokens, int from, int len) {
  int diff, tokens_len = (int) VARR_LENGTH (token_t, tokens);
  token_t *addr = VARR_ADDR (token_t, tokens);

  if (len < 0) len = tokens_len - from;
  assert (from + len <= tokens_len);
  if ((diff = tokens_len - from - len) > 0)
    memmove (addr + from, addr + from + len, diff * sizeof (token_t));
  VARR_TRUNC (token_t, tokens, tokens_len - len);
}